

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O2

void __thiscall avro::NodeSymbolic::NodeSymbolic(NodeSymbolic *this,HasName *name,NodePtr *n)

{
  sp_counted_base *psVar1;
  NoAttribute<int> local_13;
  NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12;
  NoAttribute<boost::shared_ptr<avro::Node>_> local_11;
  
  NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
  ::NodeImpl(&this->super_NodeImplSymbolic,AVRO_NUM_TYPES,name,&local_11,&local_12,&local_13);
  (this->super_NodeImplSymbolic).super_Node._vptr_Node = (_func_int **)&PTR__NodeSymbolic_0018fef8;
  (this->actualNode_).px = n->px;
  psVar1 = (n->pn).pi_;
  (this->actualNode_).pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->weak_count_ = psVar1->weak_count_ + 1;
    UNLOCK();
  }
  return;
}

Assistant:

NodeSymbolic(const HasName &name, const NodePtr n) :
        NodeImplSymbolic(AVRO_SYMBOLIC, name, NoLeaves(), NoLeafNames(), NoSize()), actualNode_(n)
    { }